

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::MessageDifferencer::UnpackAny
          (MessageDifferencer *this,Message *any,
          unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
          *data)

{
  DynamicMessageFactory *pDVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  Descriptor *pDVar5;
  DynamicMessageFactory *this_00;
  undefined4 extraout_var_00;
  undefined8 uVar6;
  LogMessage *pLVar7;
  Reflection *this_01;
  string local_e8;
  LogMessage local_c8;
  undefined1 local_90 [8];
  string serialized_value;
  string full_type_name;
  FieldDescriptor *type_url_field;
  FieldDescriptor *value_field;
  LogFinisher local_31;
  
  value_field = (FieldDescriptor *)data;
  (*(any->super_MessageLite)._vptr_MessageLite[0x13])(any);
  bVar3 = protobuf::internal::GetAnyFieldDescriptors
                    (any,(FieldDescriptor **)((long)&full_type_name.field_2 + 8),&type_url_field);
  if (!bVar3) {
    return false;
  }
  Reflection::GetString_abi_cxx11_
            (&local_e8,this_01,any,(FieldDescriptor *)full_type_name.field_2._8_8_);
  serialized_value.field_2._8_8_ = &full_type_name._M_string_length;
  full_type_name._M_dataplus._M_p = (pointer)0x0;
  full_type_name._M_string_length._0_1_ = 0;
  bVar3 = protobuf::internal::ParseAnyTypeUrl
                    (&local_e8,(string *)((long)&serialized_value.field_2 + 8));
  if (bVar3) {
    iVar4 = (*(any->super_MessageLite)._vptr_MessageLite[0x13])(any);
    pDVar5 = DescriptorPool::FindMessageTypeByName
                       (*(DescriptorPool **)(*(long *)(CONCAT44(extraout_var,iVar4) + 0x10) + 0x10),
                        (string *)((long)&serialized_value.field_2 + 8));
    if (pDVar5 != (Descriptor *)0x0) {
      this_00 = (this->dynamic_message_factory_)._M_t.
                super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                ._M_t.
                super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                _M_head_impl;
      if (this_00 == (DynamicMessageFactory *)0x0) {
        this_00 = (DynamicMessageFactory *)operator_new(0x48);
        DynamicMessageFactory::DynamicMessageFactory(this_00);
        pDVar1 = (this->dynamic_message_factory_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                 .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                 _M_head_impl;
        (this->dynamic_message_factory_)._M_t.
        super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
        .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>._M_head_impl =
             this_00;
        if (pDVar1 != (DynamicMessageFactory *)0x0) {
          (*(pDVar1->super_MessageFactory)._vptr_MessageFactory[1])();
          this_00 = (this->dynamic_message_factory_)._M_t.
                    super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                    .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                    _M_head_impl;
        }
      }
      iVar4 = (*(this_00->super_MessageFactory)._vptr_MessageFactory[2])(this_00,pDVar5);
      uVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x18))
                        ((long *)CONCAT44(extraout_var_00,iVar4));
      plVar2 = *(long **)value_field;
      *(undefined8 *)value_field = uVar6;
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 8))();
      }
      Reflection::GetString_abi_cxx11_((string *)local_90,this_01,any,type_url_field);
      bVar3 = MessageLite::ParsePartialFromString(*(MessageLite **)value_field,(string *)local_90);
      if (!bVar3) {
        protobuf::internal::LogMessage::LogMessage
                  (&local_c8,LOGLEVEL_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/util/message_differencer.cc"
                   ,0x4df);
        pLVar7 = protobuf::internal::LogMessage::operator<<(&local_c8,"Failed to parse value for ");
        pLVar7 = protobuf::internal::LogMessage::operator<<
                           (pLVar7,(string *)((long)&serialized_value.field_2 + 8));
        protobuf::internal::LogFinisher::operator=(&local_31,pLVar7);
        protobuf::internal::LogMessage::~LogMessage(&local_c8);
      }
      std::__cxx11::string::~string((string *)local_90);
      goto LAB_00341f97;
    }
    protobuf::internal::LogMessage::LogMessage
              (&local_c8,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/util/message_differencer.cc"
               ,0x4d5);
    pLVar7 = protobuf::internal::LogMessage::operator<<(&local_c8,"Proto type \'");
    pLVar7 = protobuf::internal::LogMessage::operator<<
                       (pLVar7,(string *)((long)&serialized_value.field_2 + 8));
    pLVar7 = protobuf::internal::LogMessage::operator<<(pLVar7,"\' not found");
    protobuf::internal::LogFinisher::operator=((LogFinisher *)local_90,pLVar7);
    protobuf::internal::LogMessage::~LogMessage(&local_c8);
  }
  bVar3 = false;
LAB_00341f97:
  std::__cxx11::string::~string((string *)(serialized_value.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_e8);
  return bVar3;
}

Assistant:

bool MessageDifferencer::UnpackAny(const Message& any,
                                   std::unique_ptr<Message>* data) {
  const Reflection* reflection = any.GetReflection();
  const FieldDescriptor* type_url_field;
  const FieldDescriptor* value_field;
  if (!internal::GetAnyFieldDescriptors(any, &type_url_field, &value_field)) {
    return false;
  }
  const std::string& type_url = reflection->GetString(any, type_url_field);
  std::string full_type_name;
  if (!internal::ParseAnyTypeUrl(type_url, &full_type_name)) {
    return false;
  }

  const Descriptor* desc =
      any.GetDescriptor()->file()->pool()->FindMessageTypeByName(
          full_type_name);
  if (desc == NULL) {
    GOOGLE_DLOG(ERROR) << "Proto type '" << full_type_name << "' not found";
    return false;
  }

  if (dynamic_message_factory_ == NULL) {
    dynamic_message_factory_.reset(new DynamicMessageFactory());
  }
  data->reset(dynamic_message_factory_->GetPrototype(desc)->New());
  std::string serialized_value = reflection->GetString(any, value_field);
  if (!(*data)->ParsePartialFromString(serialized_value)) {
    GOOGLE_DLOG(ERROR) << "Failed to parse value for " << full_type_name;
    return false;
  }
  return true;
}